

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  byte *pbVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long in_FS_OFFSET;
  bool bVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double local_48;
  double dStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = -NAN;
  dStack_40 = -NAN;
  *pResult = 0.0;
  iVar8 = 0;
  if (length == 0) goto LAB_0014508e;
  if (enc == '\x01') {
    iVar15 = 1;
    lVar3 = 1;
    pbVar11 = (byte *)z;
  }
  else {
    uVar10 = 3 - enc;
    uVar2 = (ulong)uVar10;
    iVar15 = 1;
    if ((int)uVar10 < (int)(length & 0xfffffffeU)) {
      uVar2 = (ulong)(int)(3 - (uint)enc);
      do {
        if (z[uVar2] != '\0') {
          iVar15 = -100;
          goto LAB_00144b4e;
        }
        uVar2 = uVar2 + 2;
      } while ((long)uVar2 < (long)(int)(length & 0xfffffffeU));
      iVar15 = 1;
    }
LAB_00144b4e:
    length = (uint)uVar2 ^ 1;
    pbVar11 = (byte *)(z + (enc & 1));
    lVar3 = 2;
  }
  pbVar5 = (byte *)(z + length);
  bVar16 = pbVar11 < pbVar5;
  if (!bVar16) goto LAB_0014508e;
  bVar1 = *pbVar11;
  while ((""[bVar1] & 1) != 0) {
    pbVar11 = pbVar11 + lVar3;
    bVar16 = pbVar11 < pbVar5;
    if (!bVar16) goto LAB_0014508e;
    bVar1 = *pbVar11;
  }
  if (!bVar16) goto LAB_0014508e;
  bVar1 = *pbVar11;
  uVar2 = 0;
  lVar12 = 0;
  if ((bVar1 - 0x2b & 0xfd) == 0) {
    lVar12 = lVar3;
  }
  pbVar11 = pbVar11 + lVar12;
  iVar8 = 1;
  bVar16 = pbVar11 < pbVar5;
  if (bVar16) {
    uVar4 = (ulong)*pbVar11;
    if (uVar4 - 0x3a < 0xfffffffffffffff6) {
      iVar13 = 0;
      iVar14 = 0;
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      iVar14 = 0;
      iVar13 = 0;
      do {
        uVar2 = ((long)(char)uVar4 + uVar2 * 10) - 0x30;
        pbVar11 = pbVar11 + lVar3;
        if (0x1999999999999997 < uVar2) {
          for (; (pbVar11 < pbVar5 && (0xfffffffffffffff5 < (ulong)*pbVar11 - 0x3a));
              pbVar11 = pbVar11 + lVar3) {
            iVar14 = iVar14 + 1;
          }
        }
        iVar13 = iVar13 + 1;
        bVar16 = pbVar11 < pbVar5;
        if (!bVar16) goto LAB_00144d1c;
        uVar4 = (ulong)*pbVar11;
      } while (0xfffffffffffffff5 < uVar4 - 0x3a);
    }
    if (bVar16) {
      if (*pbVar11 == 0x2e) {
        iVar15 = iVar15 + 1;
        while ((pbVar11 = pbVar11 + lVar3, pbVar11 < pbVar5 &&
               (0xfffffffffffffff5 < (ulong)*pbVar11 - 0x3a))) {
          if (uVar2 < 0x1999999999999998) {
            uVar2 = ((long)(char)*pbVar11 + uVar2 * 10) - 0x30;
            iVar14 = iVar14 + -1;
            iVar13 = iVar13 + 1;
          }
        }
      }
      if (pbVar11 < pbVar5) {
        if ((*pbVar11 | 0x20) == 0x65) {
          pbVar11 = pbVar11 + lVar3;
          iVar15 = iVar15 + 1;
          if (pbVar5 <= pbVar11) {
            iVar9 = 0;
            iVar8 = 1;
            bVar16 = false;
            goto LAB_00144d22;
          }
          iVar8 = 1;
          if (*pbVar11 == 0x2b) {
            pbVar11 = pbVar11 + lVar3;
          }
          else if (*pbVar11 == 0x2d) {
            pbVar11 = pbVar11 + lVar3;
            iVar8 = -1;
          }
          iVar9 = 0;
          if ((pbVar11 < pbVar5) && (uVar4 = (ulong)*pbVar11, 0xfffffffffffffff5 < uVar4 - 0x3a)) {
            iVar7 = 0;
            do {
              pbVar11 = pbVar11 + lVar3;
              iVar9 = (char)uVar4 + -0x30 + iVar7 * 10;
              if (9999 < iVar7) {
                iVar9 = 10000;
              }
              bVar16 = true;
              if (pbVar5 <= pbVar11) goto LAB_0014514f;
              uVar4 = (ulong)*pbVar11;
              iVar7 = iVar9;
            } while (0xfffffffffffffff5 < uVar4 - 0x3a);
            goto LAB_001450b8;
          }
          bVar16 = false;
        }
        else {
          iVar9 = 0;
          iVar8 = 1;
LAB_001450b8:
          bVar16 = true;
        }
LAB_0014514f:
        while ((pbVar11 < pbVar5 && ((""[*pbVar11] & 1) != 0))) {
          pbVar11 = pbVar11 + lVar3;
        }
        goto LAB_00144d22;
      }
    }
LAB_00144d1c:
    iVar9 = 0;
    bVar16 = true;
  }
  else {
    iVar14 = 0;
    iVar9 = 0;
    bVar16 = true;
    iVar13 = 0;
  }
LAB_00144d22:
  if (uVar2 == 0) {
    if (bVar1 == 0x2d) {
      dVar19 = -0.0;
    }
    else {
      dVar19 = 0.0;
    }
LAB_00145047:
    *pResult = dVar19;
  }
  else {
    iVar6 = iVar9 * iVar8 + iVar14;
    uVar4 = uVar2;
    iVar7 = iVar6;
    if ((iVar6 != 0 && SCARRY4(iVar9 * iVar8,iVar14) == iVar6 < 0) && (uVar2 < 0x19999999999998cc))
    {
      do {
        uVar4 = uVar2 * 10;
        iVar7 = iVar6 + -1;
        if (iVar6 < 2) break;
        bVar17 = uVar2 < 0x28f5c28f5c28f48;
        uVar2 = uVar4;
        iVar6 = iVar7;
      } while (bVar17);
    }
    if ((iVar7 < 0) && (iVar8 = iVar7, uVar4 == (uVar4 / 5 & 0xfffffffffffffffe) * 5)) {
      do {
        uVar4 = uVar4 / 10;
        iVar7 = iVar8 + 1;
        if (-2 < iVar8) break;
        iVar8 = iVar7;
      } while (uVar4 == (uVar4 / 10) * 10);
    }
    auVar20._8_4_ = (int)(uVar4 >> 0x20);
    auVar20._0_8_ = uVar4;
    auVar20._12_4_ = 0x45300000;
    local_48 = (auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
    dStack_40 = 0.0;
    if (local_48 <= 1.844674407370955e+19) {
      uVar2 = (long)(local_48 - 9.223372036854776e+18) & (long)local_48 >> 0x3f | (long)local_48;
      lVar3 = uVar4 - uVar2;
      if (uVar4 < uVar2) {
        lVar3 = uVar2 - uVar4;
        auVar21._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar21._0_8_ = lVar3;
        auVar21._12_4_ = 0x45300000;
        dStack_40 = -((auVar21._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
      }
      else {
        auVar22._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar22._0_8_ = lVar3;
        auVar22._12_4_ = 0x45300000;
        dStack_40 = (auVar22._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
      }
    }
    if (iVar7 < 1) {
      if (iVar7 < -99) {
        iVar8 = iVar7;
        do {
          iVar7 = iVar8 + 100;
          dekkerMul2(&local_48,1e-100,-1.9991899802602883e-117);
          bVar17 = iVar8 < -199;
          iVar8 = iVar7;
        } while (bVar17);
      }
      if (iVar7 < -9) {
        iVar8 = iVar7;
        do {
          iVar7 = iVar8 + 10;
          dekkerMul2(&local_48,1e-10,-3.643219731549774e-27);
          bVar17 = iVar8 < -0x13;
          iVar8 = iVar7;
        } while (bVar17);
      }
      if (iVar7 < 0) {
        do {
          dekkerMul2(&local_48,0.1,-5.551115123125783e-18);
          iVar7 = iVar7 + 1;
        } while (iVar7 != 0);
      }
    }
    else {
      if (99 < iVar7) {
        iVar8 = iVar7;
        do {
          iVar7 = iVar8 + -100;
          dekkerMul2(&local_48,1e+100,-1.5902891109759918e+83);
          bVar17 = 199 < iVar8;
          iVar8 = iVar7;
        } while (bVar17);
      }
      if (9 < iVar7) {
        iVar8 = iVar7;
        do {
          iVar7 = iVar8 + -10;
          dekkerMul2(&local_48,10000000000.0,0.0);
          bVar17 = 0x13 < iVar8;
          iVar8 = iVar7;
        } while (bVar17);
      }
      if (0 < iVar7) {
        iVar7 = iVar7 + 1;
        do {
          dekkerMul2(&local_48,10.0,0.0);
          iVar7 = iVar7 + -1;
        } while (1 < iVar7);
      }
    }
    dVar18 = local_48 + dStack_40;
    dVar19 = dVar18;
    if (((ulong)dVar18 & 0xfffffffffffff) != 0) {
      dVar19 = INFINITY;
    }
    if ((~(ulong)dVar18 & 0x7ff0000000000000) == 0) {
      dVar18 = dVar19;
    }
    *pResult = dVar18;
    if (bVar1 == 0x2d) {
      dVar19 = (double)((ulong)*pResult ^ (ulong)DAT_0020b2c0);
      goto LAB_00145047;
    }
  }
  iVar8 = iVar15;
  if ((!(bool)((0 < iVar13 && pbVar11 == pbVar5) & bVar16 & 0 < iVar15)) &&
     (((iVar15 < 2 || (!bVar16 && iVar15 != 3)) || (iVar8 = -1, iVar13 < 1)))) {
    iVar8 = 0;
  }
LAB_0014508e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  u64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  int nDigit = 0;  /* Number of digits processed */
  int eType = 1;   /* 1: pure integer,  2+: fractional  -1 or less: bad UTF16 */
  u64 s2;          /* round-tripped significand */
  double rr[2];

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */
  if( length==0 ) return 0;

  if( enc==SQLITE_UTF8 ){
    incr = 1;
    zEnd = z + length;
  }else{
    int i;
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    testcase( enc==SQLITE_UTF16LE );
    testcase( enc==SQLITE_UTF16BE );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    if( i<length ) eType = -100;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigit++;
    if( s>=((LARGEST_UINT64-9)/10) ){
      /* skip non-significant significand digits
      ** (increase exponent by d to shift decimal left) */
      while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; d++; }
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    eType++;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_UINT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
        nDigit++;
      }
      z+=incr;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    eType++;

    /* This branch is needed to avoid a (harmless) buffer overread.  The
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* Zero is a special case */
  if( s==0 ){
    *pResult = sign<0 ? -0.0 : +0.0;
    goto atof_return;
  }

  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;

  /* Try to adjust the exponent to make it smaller */
  while( e>0 && s<((LARGEST_UINT64-0x7ff)/10) ){
    s *= 10;
    e--;
  }
  while( e<0 && (s%10)==0 ){
    s /= 10;
    e++;
  }

  rr[0] = (double)s;
  assert( sizeof(s2)==sizeof(rr[0]) );
#ifdef SQLITE_DEBUG
  rr[1] = 18446744073709549568.0;
  memcpy(&s2, &rr[1], sizeof(s2));
  assert( s2==0x43efffffffffffffLL );
#endif
  /* Largest double that can be safely converted to u64
  **         vvvvvvvvvvvvvvvvvvvvvv   */
  if( rr[0]<=18446744073709549568.0 ){
    s2 = (u64)rr[0];
    rr[1] = s>=s2 ? (double)(s - s2) : -(double)(s2 - s);
  }else{
    rr[1] = 0.0;
  }
  assert( rr[1]<=1.0e-10*rr[0] );  /* Equal only when rr[0]==0.0 */

  if( e>0 ){
    while( e>=100  ){
      e -= 100;
      dekkerMul2(rr, 1.0e+100, -1.5902891109759918046e+83);
    }
    while( e>=10   ){
      e -= 10;
      dekkerMul2(rr, 1.0e+10, 0.0);
    }
    while( e>=1    ){
      e -= 1;
      dekkerMul2(rr, 1.0e+01, 0.0);
    }
  }else{
    while( e<=-100 ){
      e += 100;
      dekkerMul2(rr, 1.0e-100, -1.99918998026028836196e-117);
    }
    while( e<=-10  ){
      e += 10;
      dekkerMul2(rr, 1.0e-10, -3.6432197315497741579e-27);
    }
    while( e<=-1   ){
      e += 1;
      dekkerMul2(rr, 1.0e-01, -5.5511151231257827021e-18);
    }
  }
  *pResult = rr[0]+rr[1];
  if( sqlite3IsNaN(*pResult) ) *pResult = 1e300*1e300;
  if( sign<0 ) *pResult = -*pResult;
  assert( !sqlite3IsNaN(*pResult) );

atof_return:
  /* return true if number and no extra non-whitespace characters after */
  if( z==zEnd && nDigit>0 && eValid && eType>0 ){
    return eType;
  }else if( eType>=2 && (eType==3 || eValid) && nDigit>0 ){
    return -1;
  }else{
    return 0;
  }
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}